

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecVec.h
# Opt level: O1

void Vec_VecFree(Vec_Vec_t *p)

{
  void *__ptr;
  long lVar1;
  
  if (0 < p->nSize) {
    lVar1 = 0;
    do {
      __ptr = p->pArray[lVar1];
      if (__ptr != (void *)0x0) {
        if (*(void **)((long)__ptr + 8) != (void *)0x0) {
          free(*(void **)((long)__ptr + 8));
          *(undefined8 *)((long)__ptr + 8) = 0;
        }
        free(__ptr);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < p->nSize);
  }
  if (p->pArray != (void **)0x0) {
    free(p->pArray);
    p->pArray = (void **)0x0;
  }
  if (p != (Vec_Vec_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

static inline void Vec_VecFree( Vec_Vec_t * p )
{
    Vec_Ptr_t * vVec;
    int i;
    Vec_VecForEachLevel( p, vVec, i )
        if ( vVec ) Vec_PtrFree( vVec );
    Vec_PtrFree( (Vec_Ptr_t *)p );
}